

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPUDPv4Transmitter::GetLocalIPList_Interfaces(RTPUDPv4Transmitter *this)

{
  bool bVar1;
  uint32_t local_34;
  long local_30;
  sockaddr_in *inaddr;
  ifaddrs *tmp;
  ifaddrs *addrs;
  RTPUDPv4Transmitter *this_local;
  
  addrs = (ifaddrs *)this;
  getifaddrs(&tmp);
  for (inaddr = (sockaddr_in *)tmp; inaddr != (sockaddr_in *)0x0; inaddr = *(sockaddr_in **)inaddr)
  {
    if ((*(long *)inaddr[1].sin_zero != 0) && (**(short **)inaddr[1].sin_zero == 2)) {
      local_30 = *(long *)inaddr[1].sin_zero;
      local_34 = ntohl(*(uint32_t *)(local_30 + 4));
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->localIPs,&local_34);
    }
  }
  freeifaddrs(tmp);
  bVar1 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->localIPs);
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool RTPUDPv4Transmitter::GetLocalIPList_Interfaces()
{
	struct ifaddrs *addrs,*tmp;
	
	getifaddrs(&addrs);
	tmp = addrs;
	
	while (tmp != 0)
	{
		if (tmp->ifa_addr != 0 && tmp->ifa_addr->sa_family == AF_INET)
		{
			struct sockaddr_in *inaddr = (struct sockaddr_in *)tmp->ifa_addr;
			localIPs.push_back(ntohl(inaddr->sin_addr.s_addr));
		}
		tmp = tmp->ifa_next;
	}
	
	freeifaddrs(addrs);
	
	if (localIPs.empty())
		return false;
	return true;
}